

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_from_16(uint16_t a,uint16_t b,uint16_t c,uint16_t d)

{
  c_v64 cVar1;
  uint16_t d_local;
  uint16_t c_local;
  uint16_t b_local;
  uint16_t a_local;
  c_v64 t;
  
  cVar1.u16[1] = c;
  cVar1.u16[0] = d;
  cVar1.u16[2] = b;
  cVar1.u16[3] = a;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_from_16(uint16_t a, uint16_t b, uint16_t c,
                                uint16_t d) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    t.u16[0] = a;
    t.u16[1] = b;
    t.u16[2] = c;
    t.u16[3] = d;
  } else {
    t.u16[3] = a;
    t.u16[2] = b;
    t.u16[1] = c;
    t.u16[0] = d;
  }
  return t;
}